

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.cpp
# Opt level: O2

KBOOL __thiscall KDIS::KDataStream::operator==(KDataStream *this,KDataStream *Value)

{
  bool bVar1;
  
  bVar1 = std::operator!=(&this->m_vBuffer,&Value->m_vBuffer);
  return !bVar1;
}

Assistant:

KBOOL KDataStream::operator == ( const KDataStream & Value ) const
{
    if( m_vBuffer != Value.m_vBuffer ) return false;
    return true;
}